

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O3

ON_V5ExtrusionDisplayMeshCache * ON_V5ExtrusionDisplayMeshCache::CreateMeshCache(ON_Extrusion *p)

{
  ON_MeshCache *this;
  bool bVar1;
  uint uVar2;
  ON_V5ExtrusionDisplayMeshCache *this_00;
  ON_UUID mesh_id;
  ON_UUID mesh_id_00;
  shared_ptr<ON_Mesh> analysis_mesh;
  shared_ptr<ON_Mesh> render_mesh;
  ON_MeshCache local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  ON_MeshCache local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  ON_UUID local_20;
  
  if (p == (ON_Extrusion *)0x0) {
    return (ON_V5ExtrusionDisplayMeshCache *)0x0;
  }
  this = &p->m_mesh_cache;
  uVar2 = ON_MeshCache::MeshCount(this);
  if (uVar2 == 0) {
    return (ON_V5ExtrusionDisplayMeshCache *)0x0;
  }
  mesh_id.Data4 = (uchar  [8])0x49fda7a2f5e3baa9;
  mesh_id._0_8_ = this;
  ON_MeshCache::MeshSharedPtr(&local_30,mesh_id);
  mesh_id_00.Data4 = (uchar  [8])0x437ba29fac12f955;
  mesh_id_00._0_8_ = this;
  ON_MeshCache::MeshSharedPtr(&local_40,mesh_id_00);
  if ((element_type *)local_40.m_impl != (element_type *)0x0 ||
      (element_type *)local_30.m_impl != (element_type *)0x0) {
    local_20 = ON_ClassId::Uuid(&m_ON_V5ExtrusionDisplayMeshCache_class_rtti);
    this_00 = (ON_V5ExtrusionDisplayMeshCache *)ON_Object::GetUserData((ON_Object *)p,&local_20);
    if ((this_00 != (ON_V5ExtrusionDisplayMeshCache *)0x0) &&
       (bVar1 = ON_Object::IsKindOf((ON_Object *)this_00,
                                    &m_ON_V5ExtrusionDisplayMeshCache_class_rtti), bVar1))
    goto LAB_003c4f43;
    this_00 = (ON_V5ExtrusionDisplayMeshCache *)operator_new(0xe8);
    ON_V5ExtrusionDisplayMeshCache(this_00);
    bVar1 = ON_Object::AttachUserData((ON_Object *)p,(ON_UserData *)this_00);
    if (bVar1) {
      (this_00->m_render_mesh).super___shared_ptr<ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_30.m_impl;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this_00->m_render_mesh).super___shared_ptr<ON_Mesh,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,&local_28);
      (this_00->m_analysis_mesh).super___shared_ptr<ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_40.m_impl;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this_00->m_analysis_mesh).super___shared_ptr<ON_Mesh,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,&local_38);
      goto LAB_003c4f43;
    }
    (*(this_00->super_ON_UserData).super_ON_Object._vptr_ON_Object[4])(this_00);
  }
  this_00 = (ON_V5ExtrusionDisplayMeshCache *)0x0;
LAB_003c4f43:
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  if (local_28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28._M_pi);
    return this_00;
  }
  return this_00;
}

Assistant:

ON_V5ExtrusionDisplayMeshCache* ON_V5ExtrusionDisplayMeshCache::CreateMeshCache(const ON_Extrusion* p)
{
  if ( 0 == p )
    return nullptr;

  if (p->m_mesh_cache.MeshCount() <= 0)
    return nullptr;

  std::shared_ptr<ON_Mesh> render_mesh = p->m_mesh_cache.MeshSharedPtr(ON_MeshCache::RenderMeshId);
  std::shared_ptr<ON_Mesh> analysis_mesh = p->m_mesh_cache.MeshSharedPtr(ON_MeshCache::AnalysisMeshId);

  if (nullptr == render_mesh.get() && nullptr == analysis_mesh.get() )
    return nullptr;

  ON_V5ExtrusionDisplayMeshCache* mc = ON_V5ExtrusionDisplayMeshCache::Cast( p->GetUserData(ON_CLASS_ID(ON_V5ExtrusionDisplayMeshCache)) );
  if ( nullptr == mc )
  {
    mc = new ON_V5ExtrusionDisplayMeshCache();
    if ( false == const_cast<ON_Extrusion*>(p)->AttachUserData(mc) )
    {
      delete mc;
      mc = nullptr;
    }
    else
    {
      mc->m_render_mesh = render_mesh;
      mc->m_analysis_mesh = analysis_mesh;
    }
  }

  return mc;
}